

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined2 *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined2 *puVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  
  iVar15 = 1 << ((byte)tableLog & 0x1f);
  uVar13 = maxSymbolValue + 1;
  uVar5 = tableLog - 5;
  iVar10 = tableLog + 1;
  puVar12 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar4 = 4;
  uVar9 = 0;
  bVar18 = false;
  puVar7 = (undefined2 *)header;
  uVar6 = iVar15 + 1;
  do {
    uVar8 = uVar9;
    if ((uVar13 <= uVar9) || ((int)uVar6 < 2)) goto LAB_0010af08;
    if (bVar18) {
      uVar17 = (ulong)uVar9;
      iVar14 = 0;
      while( true ) {
        uVar8 = uVar13;
        if (uVar17 == uVar13) goto LAB_0010af08;
        if (normalizedCounter[uVar17] != 0) break;
        uVar17 = uVar17 + 1;
        iVar14 = iVar14 + 1;
      }
      uVar16 = (uint)uVar17;
      if (uVar16 == uVar13) {
LAB_0010af08:
        sVar3 = 0xffffffffffffffff;
        if (uVar6 == 1) {
          if (uVar13 < uVar8) {
            __assert_fail("symbol <= alphabetSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x164e,
                          "size_t FSE_writeNCount_generic(void *, size_t, const short *, unsigned int, unsigned int, unsigned int)"
                         );
          }
          if ((writeIsSafe != 0) || (sVar3 = 0xffffffffffffffba, puVar7 <= puVar12)) {
            *puVar7 = (short)uVar5;
            sVar3 = (long)puVar7 + ((long)((iVar4 + 7) / 8) - (long)header);
          }
        }
        return sVar3;
      }
      uVar8 = uVar9 + 3;
      while (uVar9 = uVar9 + 0x18, uVar9 <= uVar16) {
        if ((writeIsSafe == 0) && (puVar12 < puVar7)) {
          return 0xffffffffffffffba;
        }
        uVar5 = uVar5 + (0xffff << ((byte)iVar4 & 0x1f));
        *puVar7 = (short)uVar5;
        puVar7 = puVar7 + 1;
        uVar5 = uVar5 >> 0x10;
        iVar14 = iVar14 + -0x18;
        uVar8 = uVar8 + 0x18;
      }
      for (; uVar8 <= uVar16; uVar8 = uVar8 + 3) {
        uVar5 = uVar5 + (3 << ((byte)iVar4 & 0x1f));
        iVar4 = iVar4 + 2;
        iVar14 = iVar14 + -3;
      }
      uVar5 = (iVar14 << ((byte)iVar4 & 0x1f)) + uVar5;
      if (iVar4 < 0xf) {
        iVar4 = iVar4 + 2;
      }
      else {
        if ((writeIsSafe == 0) && (puVar12 < puVar7)) {
          return 0xffffffffffffffba;
        }
        *puVar7 = (short)uVar5;
        puVar7 = puVar7 + 1;
        uVar5 = uVar5 >> 0x10;
        iVar4 = iVar4 + -0xe;
      }
    }
    else {
      uVar17 = (ulong)uVar9;
    }
    iVar2 = (int)normalizedCounter[uVar17 & 0xffffffff];
    iVar14 = -iVar2;
    if (0 < iVar2) {
      iVar14 = iVar2;
    }
    iVar1 = ~uVar6 + iVar15 * 2;
    iVar11 = iVar1;
    if (iVar2 + 1 < iVar15) {
      iVar11 = 0;
    }
    iVar2 = iVar11 + iVar2 + 1;
    bVar18 = iVar2 == 1;
    uVar8 = uVar6 - iVar14;
    if (uVar8 == 0 || (int)uVar6 < iVar14) {
      return 0xffffffffffffffff;
    }
    uVar9 = (int)uVar17 + 1;
    uVar5 = (iVar2 << ((byte)iVar4 & 0x1f)) + uVar5;
    iVar4 = (iVar4 + iVar10) - (uint)(iVar2 < iVar1);
    for (; (int)uVar8 < iVar15; iVar15 = iVar15 >> 1) {
      iVar10 = iVar10 + -1;
    }
    uVar6 = uVar8;
    if (0x10 < iVar4) {
      if (writeIsSafe == 0 && puVar12 < puVar7) {
        return 0xffffffffffffffba;
      }
      *puVar7 = (short)uVar5;
      puVar7 = puVar7 + 1;
      uVar5 = uVar5 >> 0x10;
      iVar4 = iVar4 + -0x10;
    }
  } while( true );
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    return (out-ostart);
}